

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,uint8_t *mask,int mask_stride,int h,__m256i *round_offset,int shift,
               __m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  long in_stack_00000008;
  undefined4 in_stack_00000024;
  undefined4 in_stack_00000034;
  __m256i m4567;
  __m256i m57;
  __m256i m46;
  __m256i mask_0a;
  __m256i m0123;
  __m256i m13;
  __m256i m02;
  __m256i two_w;
  __m256i one_b;
  undefined4 in_stack_fffffffffffffb7c;
  void *in_stack_fffffffffffffb80;
  __m256i *in_stack_fffffffffffffb88;
  undefined5 in_stack_fffffffffffffb98;
  undefined1 uVar6;
  undefined2 uVar7;
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  int local_314;
  long local_310;
  int local_304;
  long local_300;
  int local_2f4;
  long local_2f0;
  undefined2 local_2e4;
  undefined1 local_2e1;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined4 local_184;
  undefined1 local_180 [32];
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0 [32];
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  int src1_stride_00;
  CONV_BUF_TYPE *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  CONV_BUF_TYPE *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  uint16_t *in_stack_ffffffffffffffd0;
  
  local_2e1 = 1;
  uVar6 = 1;
  local_a1 = 1;
  local_a2 = 1;
  local_a3 = 1;
  local_a4 = 1;
  local_a5 = 1;
  local_a6 = 1;
  local_a7 = 1;
  local_a8 = 1;
  local_a9 = 1;
  local_aa = 1;
  local_ab = 1;
  local_ac = 1;
  local_ad = 1;
  local_ae = 1;
  local_af = 1;
  local_b0 = 1;
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_b4 = 1;
  local_b5 = 1;
  local_b6 = 1;
  local_b7 = 1;
  local_b8 = 1;
  local_b9 = 1;
  local_ba = 1;
  local_bb = 1;
  local_bc = 1;
  local_bd = 1;
  local_be = 1;
  local_bf = 1;
  local_c0 = 1;
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  local_e0 = vpinsrb_avx(auVar1,1,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auStack_d0 = vpinsrb_avx(auVar1,1,0xf);
  local_340 = local_e0._0_8_;
  uStack_338 = local_e0._8_8_;
  uStack_330 = auStack_d0._0_8_;
  uStack_328 = auStack_d0._8_8_;
  local_2e4 = 2;
  uVar7 = 2;
  src1_stride_00 = 0x20002;
  local_56 = 2;
  local_58 = 2;
  local_5a = 2;
  local_5c = 2;
  local_5e = 2;
  local_60 = 2;
  local_62 = 2;
  local_64 = 2;
  local_66 = 2;
  local_68 = 2;
  local_6a = 2;
  local_6c = 2;
  local_6e = 2;
  local_70 = 2;
  auVar1 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar1 = vpinsrw_avx(auVar1,2,2);
  auVar1 = vpinsrw_avx(auVar1,2,3);
  auVar1 = vpinsrw_avx(auVar1,2,4);
  auVar1 = vpinsrw_avx(auVar1,2,5);
  auVar1 = vpinsrw_avx(auVar1,2,6);
  auVar1 = vpinsrw_avx(auVar1,2,7);
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auVar2 = vpinsrw_avx(auVar2,2,7);
  local_360._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_360._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar5 = ZEXT3264(local_360);
  local_314 = in_R9D;
  local_310 = in_R8;
  local_304 = in_ECX;
  local_300 = in_RDX;
  local_2f4 = in_ESI;
  local_2f0 = in_RDI;
  local_a0 = local_360;
  do {
    auVar3 = auVar5._0_32_;
    yy_loadu2_128(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_380 = auVar3;
    yy_loadu2_128(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_3a0._0_8_ = auVar3._0_8_;
    local_3a0._8_8_ = auVar3._8_8_;
    local_3a0._16_8_ = auVar3._16_8_;
    local_3a0._24_8_ = auVar3._24_8_;
    local_280 = local_380._0_8_;
    uStack_278 = local_380._8_8_;
    uStack_270 = local_380._16_8_;
    uStack_268 = local_380._24_8_;
    local_2a0 = local_3a0._0_8_;
    uStack_298 = local_3a0._8_8_;
    uStack_290 = local_3a0._16_8_;
    uStack_288 = local_3a0._24_8_;
    local_200 = vpaddusb_avx2(local_380,auVar3);
    local_220 = local_340;
    uStack_218 = uStack_338;
    uStack_210 = uStack_330;
    uStack_208 = uStack_328;
    auVar4._8_8_ = uStack_338;
    auVar4._0_8_ = local_340;
    auVar4._16_8_ = uStack_330;
    auVar4._24_8_ = uStack_328;
    local_3c0 = vpmaddubsw_avx2(local_200,auVar4);
    local_100 = local_3c0._0_8_;
    uStack_f8 = local_3c0._8_8_;
    uStack_f0 = local_3c0._16_8_;
    uStack_e8 = local_3c0._24_8_;
    local_120 = local_360._0_8_;
    uStack_118 = local_360._8_8_;
    uStack_110 = local_360._16_8_;
    uStack_108 = local_360._24_8_;
    local_180 = vpaddw_avx2(local_3c0,local_360);
    local_184 = 2;
    auVar4 = vpsrlw_avx2(local_180,ZEXT416(2));
    local_3e0 = auVar4;
    local_3a0 = auVar3;
    yy_loadu2_128(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_400 = auVar4;
    yy_loadu2_128(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_420._0_8_ = auVar4._0_8_;
    local_420._8_8_ = auVar4._8_8_;
    local_420._16_8_ = auVar4._16_8_;
    local_420._24_8_ = auVar4._24_8_;
    local_2c0 = local_400._0_8_;
    uStack_2b8 = local_400._8_8_;
    uStack_2b0 = local_400._16_8_;
    uStack_2a8 = local_400._24_8_;
    local_2e0 = local_420._0_8_;
    uStack_2d8 = local_420._8_8_;
    uStack_2d0 = local_420._16_8_;
    uStack_2c8 = local_420._24_8_;
    local_240 = vpaddusb_avx2(local_400,auVar4);
    local_260 = local_340;
    uStack_258 = uStack_338;
    uStack_250 = uStack_330;
    uStack_248 = uStack_328;
    auVar3._8_8_ = uStack_338;
    auVar3._0_8_ = local_340;
    auVar3._16_8_ = uStack_330;
    auVar3._24_8_ = uStack_328;
    local_440 = vpmaddubsw_avx2(local_240,auVar3);
    local_140 = local_440._0_8_;
    uStack_138 = local_440._8_8_;
    uStack_130 = local_440._16_8_;
    uStack_128 = local_440._24_8_;
    local_160 = local_360._0_8_;
    uStack_158 = local_360._8_8_;
    uStack_150 = local_360._16_8_;
    uStack_148 = local_360._24_8_;
    local_1c0 = vpaddw_avx2(local_440,local_360);
    local_1c4 = 2;
    local_460 = (__m256i)vpsrlw_avx2(local_1c0,ZEXT416(2));
    in_stack_fffffffffffffb80 = (void *)CONCAT44(in_stack_00000034,shift);
    auVar5 = ZEXT1664(local_460._0_16_);
    in_stack_fffffffffffffb88 = clip_low;
    local_420 = auVar4;
    highbd_blend_a64_d16_mask_w8_avx2
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,src1_stride_00,&local_460,
               (__m256i *)CONCAT44(in_stack_00000024,h),
               (__m256i *)CONCAT44(in_stack_fffffffffffffb7c,round_offset._0_4_),shift,clip_low,
               clip_high,(__m256i *)CONCAT26(uVar7,CONCAT15(uVar6,in_stack_fffffffffffffb98)));
    local_2f0 = local_2f0 + (long)(local_2f4 << 2) * 2;
    local_300 = local_300 + (long)(local_304 << 2) * 2;
    local_310 = local_310 + (long)(local_314 << 2) * 2;
    in_stack_00000008 = in_stack_00000008 + ((int)mask << 3);
    mask_stride = mask_stride + -4;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw1_subh1_w8_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const uint8_t *mask,
    int mask_stride, int h, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  const __m256i one_b = _mm256_set1_epi8(1);
  const __m256i two_w = _mm256_set1_epi16(2);
  do {
    // Load 16x u8 pixels from each of 8 rows in the mask,
    // (saturating) add together rows then use madd to add adjacent pixels
    // Finally, divide each value by 4 (with rounding)
    const __m256i m02 =
        yy_loadu2_128(mask + 0 * mask_stride, mask + 2 * mask_stride);
    const __m256i m13 =
        yy_loadu2_128(mask + 1 * mask_stride, mask + 3 * mask_stride);
    const __m256i m0123 =
        _mm256_maddubs_epi16(_mm256_adds_epu8(m02, m13), one_b);
    const __m256i mask_0a =
        _mm256_srli_epi16(_mm256_add_epi16(m0123, two_w), 2);
    const __m256i m46 =
        yy_loadu2_128(mask + 4 * mask_stride, mask + 6 * mask_stride);
    const __m256i m57 =
        yy_loadu2_128(mask + 5 * mask_stride, mask + 7 * mask_stride);
    const __m256i m4567 =
        _mm256_maddubs_epi16(_mm256_adds_epu8(m46, m57), one_b);
    const __m256i mask_0b =
        _mm256_srli_epi16(_mm256_add_epi16(m4567, two_w), 2);

    highbd_blend_a64_d16_mask_w8_avx2(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask_0a,
        &mask_0b, round_offset, shift, clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 8;
  } while (h -= 4);
}